

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

void pztopology::TPZPrism::MapToSide<double>
               (int side,TPZVec<double> *InternalPar,TPZVec<double> *SidePar,
               TPZFMatrix<double> *JacToSide)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  int64_t iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int side_local;
  
  side_local = side;
  GetTolerance();
  pdVar3 = InternalPar->fStore;
  dVar8 = *pdVar3;
  dVar7 = pdVar3[1];
  dVar6 = pdVar3[2];
  bVar1 = CheckProjectionForSingularity<double>(&side_local,InternalPar);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Side projection is not regular and it should have been checked earlier. Aborting.."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
               ,0x428);
  }
  switch(side_local) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    (*SidePar->_vptr_TPZVec[3])(SidePar,0);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,0,0);
    break;
  case 6:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar7 = dVar7 + -1.0;
    *SidePar->fStore = -1.0 - (dVar8 + dVar8) / dVar7;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = -2.0 / dVar7;
    goto LAB_00e0018c;
  case 7:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    goto LAB_00e001d6;
  case 8:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar6 = dVar8 + -1.0;
    *SidePar->fStore = (dVar7 + dVar7) / dVar6 + 1.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = (dVar7 * -2.0) / (dVar6 * dVar6);
    goto LAB_00e0050b;
  case 9:
  case 10:
  case 0xb:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    *SidePar->fStore = dVar6;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = 0.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
    *pdVar3 = 0.0;
    iVar4 = 0;
    goto LAB_00e0062c;
  case 0xc:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar7 = 1.0 - dVar7;
    *SidePar->fStore = (dVar8 + dVar8) / dVar7 + -1.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = 2.0 / dVar7;
LAB_00e0018c:
    dVar6 = (dVar8 + dVar8) / (dVar7 * dVar7);
LAB_00e0022a:
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
LAB_00e00522:
    *pdVar3 = dVar6;
    iVar4 = 0;
LAB_00e0052e:
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,iVar4,2);
    *pdVar3 = 0.0;
    break;
  case 0xd:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
LAB_00e001d6:
    dVar6 = dVar8 + dVar7;
    *SidePar->fStore = (dVar7 + dVar7) / dVar6 + -1.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = (dVar7 * -2.0) / (dVar6 * dVar6);
    dVar6 = (dVar8 + dVar8) / (dVar6 * dVar6);
    goto LAB_00e0022a;
  case 0xe:
    (*SidePar->_vptr_TPZVec[3])(SidePar,1);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,1,3);
    dVar6 = dVar8 + -1.0;
    *SidePar->fStore = (dVar7 + dVar7) / dVar6 + 1.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = (dVar7 * -2.0) / (dVar6 * dVar6);
LAB_00e0050b:
    dVar6 = 2.0 / (dVar8 + -1.0);
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
    goto LAB_00e00522;
  case 0xf:
  case 0x13:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    pdVar3 = SidePar->fStore;
    *pdVar3 = dVar8;
    pdVar3[1] = dVar7;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = 1.0;
    iVar4 = 1;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
    *pdVar3 = 0.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,2);
    *pdVar3 = 0.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,1,0);
    *pdVar3 = 0.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,1,1);
    *pdVar3 = 1.0;
    goto LAB_00e0052e;
  case 0x10:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    dVar7 = dVar7 + -1.0;
    pdVar3 = SidePar->fStore;
    *pdVar3 = -1.0 - (dVar8 + dVar8) / dVar7;
    pdVar3[1] = dVar6;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = -2.0 / dVar7;
    dVar8 = (dVar8 + dVar8) / (dVar7 * dVar7);
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
    goto LAB_00e005eb;
  case 0x11:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    dVar5 = dVar8 + dVar7;
    pdVar3 = SidePar->fStore;
    *pdVar3 = (dVar7 + dVar7) / dVar5 + -1.0;
    pdVar3[1] = dVar6;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = (dVar7 * -2.0) / (dVar5 * dVar5);
    dVar8 = (dVar8 + dVar8) / (dVar5 * dVar5);
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
    goto LAB_00e005eb;
  case 0x12:
    (*SidePar->_vptr_TPZVec[3])(SidePar,2);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,2,3);
    dVar8 = dVar8 + -1.0;
    pdVar3 = SidePar->fStore;
    *pdVar3 = -1.0 - (dVar7 + dVar7) / dVar8;
    pdVar3[1] = dVar6;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,0);
    *pdVar3 = (dVar7 + dVar7) / (dVar8 * dVar8);
    dVar8 = -2.0 / dVar8;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,1);
LAB_00e005eb:
    iVar4 = 1;
    *pdVar3 = dVar8;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,0,2);
    *pdVar3 = 0.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,1,0);
    *pdVar3 = 0.0;
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,1,1);
    *pdVar3 = 0.0;
LAB_00e0062c:
    pdVar3 = TPZFMatrix<double>::operator()(JacToSide,iVar4,2);
    *pdVar3 = 1.0;
    break;
  case 0x14:
    TPZVec<double>::operator=(SidePar,InternalPar);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacToSide,3);
    (*(JacToSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x29])(JacToSide);
  }
  if (side_local < 0x15) {
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "Cant compute MapToSide method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "This should have been caught earlier in the execution, there is something wrong.\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "Check method TPZTetrahedron::CheckProjectionForSingularity<T>\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
             ,0x4da);
}

Assistant:

void TPZPrism::MapToSide(int side, TPZVec<T> &InternalPar, TPZVec<T> &SidePar, TPZFMatrix<T> &JacToSide) {
        double zero = pztopology::GetTolerance();

        T qsi = InternalPar[0];
        T eta = InternalPar[1];
        T zeta = InternalPar[2];

        if(!CheckProjectionForSingularity(side,InternalPar)){
            std::cout<<"Side projection is not regular and it should have been checked earlier. Aborting.."<<std::endl;
            DebugStop();
        }
        switch(side)
        {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            {
                SidePar.Resize(0); JacToSide.Resize(0,0);
                break;
            }
            case 6://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = -1 + eta;
                    SidePar[0] = -1 - (2*qsi)/den;
                    JacToSide(0,0) = -2/den;
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 7://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = eta + qsi;
                    SidePar[0] = -1 + (2*eta)/den;
                    JacToSide(0,0) = (-2*eta)/(den*den);
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 8://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = -1 + qsi;
                    SidePar[0] = 1 + (2*eta)/den;
                    JacToSide(0,0) = (-2*eta)/(den*den);
                    JacToSide(0,1) = 2/den;
                    JacToSide(0,2) = 0;
                }
                break;

            case 9://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 10://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 11://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 12://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = 1 - eta;
                    SidePar[0] = -1 +(2*qsi)/den;
                    JacToSide(0,0) = 2/den;
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 13://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    SidePar[0] = -1 + (2*eta)/(eta + qsi);
                    JacToSide(0,0) = (-2*eta)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,1) = (2*qsi)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,2) = 0;
                }
                break;

            case 14://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    SidePar[0] = 1 + (2*eta)/(-1 + qsi);
                    JacToSide(0,0) = (-2*eta)/((-1 + qsi)*(-1 + qsi));
                    JacToSide(0,1) = 2/(-1 + qsi);
                    JacToSide(0,2) = 0;
                }
                break;

            case 15://2D - triangle
                SidePar.Resize(2); JacToSide.Resize(2,3);
                SidePar[0] = qsi;
                SidePar[1] = eta;
                JacToSide(0,0) = 1;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 0;
                JacToSide(1,0) = 0;
                JacToSide(1,1) = 1;
                JacToSide(1,2) = 0;
                break;

            case 16://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 - (2*qsi)/(-1 + eta);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = -2/(-1 + eta);
                    JacToSide(0,1) = (2*qsi)/((-1 + eta)*(-1 + eta));
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 17://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 + (2*eta)/(eta + qsi);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = (-2*eta)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,1) = (2*qsi)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 18://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 - (2*eta)/(-1 + qsi);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = (2*eta)/((-1 + qsi)*(-1 + qsi));
                    JacToSide(0,1) = -2/(-1 + qsi);
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 19://2D - triangle
                SidePar.Resize(2); JacToSide.Resize(2,3);
                SidePar[0] = qsi;
                SidePar[1] = eta;
                JacToSide(0,0) = 1;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 0;
                JacToSide(1,0) = 0;
                JacToSide(1,1) = 1;
                JacToSide(1,2) = 0;
                break;
            case 20:
                SidePar = InternalPar;
                JacToSide.Resize(3, 3);
                JacToSide.Identity();
                break;
        }
        if(side > 20)
        {
            cout << "Cant compute MapToSide method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n";
            cout << "This should have been caught earlier in the execution, there is something wrong.\n";
            cout << "Check method TPZTetrahedron::CheckProjectionForSingularity<T>\n";
            DebugStop();
        }
    }